

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

config * newconfig(void)

{
  config *pcVar1;
  long lVar2;
  config *pcVar3;
  
  if (freelist == (config *)0x0) {
    pcVar3 = (config *)0x3;
    pcVar1 = (config *)calloc(3,0x48);
    freelist = pcVar1;
    if (pcVar1 == (config *)0x0) {
      newconfig_cold_1();
      pcVar1 = freelist;
      pcVar3->next = freelist;
      freelist = pcVar3;
      return pcVar1;
    }
    lVar2 = 1;
    pcVar3 = pcVar1;
    do {
      pcVar3->next = pcVar3 + 1;
      lVar2 = lVar2 + -1;
      pcVar3 = pcVar3 + 1;
    } while (lVar2 == 0);
    pcVar1[2].next = (config *)0x0;
  }
  pcVar1 = freelist;
  freelist = freelist->next;
  return pcVar1;
}

Assistant:

config *newconfig(){
  struct config *newcfg;
  if( freelist==0 ){
    int i;
    int amt = 3;
    freelist = (struct config *)calloc( amt, sizeof(struct config) );
    if( freelist==0 ){
      fprintf(stderr,"Unable to allocate memory for a new configuration.");
      exit(1);
    }
    for(i=0; i<amt-1; i++) freelist[i].next = &freelist[i+1];
    freelist[amt-1].next = 0;
  }
  newcfg = freelist;
  freelist = freelist->next;
  return newcfg;
}